

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadStartFunction(WasmBinaryReader *this)

{
  bool bVar1;
  ArgSlot AVar2;
  uint in_EAX;
  uint funcIndex;
  Type funcType;
  WasmFunctionInfo *pWVar3;
  WasmBinaryReader *pWVar4;
  WasmBinaryReader *this_00;
  undefined8 uStack_28;
  uint32 len;
  
  uStack_28 = (ulong)in_EAX;
  funcIndex = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&uStack_28 + 4));
  funcType = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,funcIndex);
  pWVar4 = (WasmBinaryReader *)(ulong)(uint)funcType;
  bVar1 = FunctionIndexTypes::CanBeExported(funcType);
  if (!bVar1) {
    ThrowDecodingError(pWVar4,L"Invalid function index for start function %u",(ulong)funcIndex);
  }
  pWVar3 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,funcIndex);
  pWVar4 = (WasmBinaryReader *)(pWVar3->m_signature).ptr;
  this_00 = pWVar4;
  AVar2 = WasmSignature::GetParamCount((WasmSignature *)pWVar4);
  if ((AVar2 == 0) &&
     (*(Type *)((long)&(pWVar4->super_WasmReaderBase)._vptr_WasmReaderBase + 4) == 0)) {
    Js::WebAssemblyModule::SetStartFunction(this->m_module,funcIndex);
    return;
  }
  ThrowDecodingError(this_00,L"Start function must be void and nullary");
}

Assistant:

void WasmBinaryReader::ReadStartFunction()
{
    uint32 len = 0;
    uint32 id = LEB128(len);
    Wasm::FunctionIndexTypes::Type funcType = m_module->GetFunctionIndexType(id);
    if (!FunctionIndexTypes::CanBeExported(funcType))
    {
        ThrowDecodingError(_u("Invalid function index for start function %u"), id);
    }
    WasmSignature* sig = m_module->GetWasmFunctionInfo(id)->GetSignature();
    if (sig->GetParamCount() > 0 || sig->GetResultCount())
    {
        ThrowDecodingError(_u("Start function must be void and nullary"));
    }
    m_module->SetStartFunction(id);
}